

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int switch_case_2d(Color color,Directions direction)

{
  int iVar1;
  optional<enum_fuse_t> oVar2;
  
  oVar2 = magic_enum::enum_fuse<Color,Directions>(color,direction);
  if (((undefined1  [16])
       oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
       super__Optional_payload_base<enum_fuse_t> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  {
    iVar1 = 1;
    if (oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
        super__Optional_payload_base<enum_fuse_t>._M_payload != 8) {
      iVar1 = (uint)(oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
                     super__Optional_payload_base<enum_fuse_t>._M_payload == 6) * 2;
    }
    return iVar1;
  }
  Catch::clara::std::__throw_bad_optional_access();
}

Assistant:

static int switch_case_2d(Color color, Directions direction) {
  switch (enum_fuse(color, direction).value()) {
    case enum_fuse(Color::RED, Directions::Up).value():
      return 1;
    case enum_fuse(Color::BLUE, Directions::Down).value():
      return 2;
    default:
      return 0;
  }
}